

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecmult_impl.h
# Opt level: O0

void secp256k1_ecmult(secp256k1_gej *r,secp256k1_gej *a,secp256k1_scalar *na,secp256k1_scalar *ng)

{
  secp256k1_strauss_state state;
  secp256k1_strauss_point_state ps [1];
  secp256k1_ge pre_a [8];
  secp256k1_fe aux [8];
  secp256k1_scalar *in_stack_fffffffffffffd68;
  secp256k1_scalar *in_stack_fffffffffffffd70;
  secp256k1_gej *in_stack_fffffffffffffd78;
  size_t in_stack_fffffffffffffd80;
  secp256k1_gej *in_stack_fffffffffffffd88;
  secp256k1_strauss_state *in_stack_fffffffffffffd90;
  
  secp256k1_ecmult_strauss_wnaf
            (in_stack_fffffffffffffd90,in_stack_fffffffffffffd88,in_stack_fffffffffffffd80,
             in_stack_fffffffffffffd78,in_stack_fffffffffffffd70,in_stack_fffffffffffffd68);
  return;
}

Assistant:

static void secp256k1_ecmult(secp256k1_gej *r, const secp256k1_gej *a, const secp256k1_scalar *na, const secp256k1_scalar *ng) {
    secp256k1_fe aux[ECMULT_TABLE_SIZE(WINDOW_A)];
    secp256k1_ge pre_a[ECMULT_TABLE_SIZE(WINDOW_A)];
    struct secp256k1_strauss_point_state ps[1];
    struct secp256k1_strauss_state state;

    state.aux = aux;
    state.pre_a = pre_a;
    state.ps = ps;
    secp256k1_ecmult_strauss_wnaf(&state, r, 1, a, na, ng);
}